

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

int mg_base64_decode(char *src,size_t src_len,uchar *dst,size_t *dst_len)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  byte bVar4;
  uchar uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  int iVar10;
  
  if (dst_len == (size_t *)0x0) {
    sVar8 = 0xffffffffffffffff;
  }
  else {
    sVar8 = *dst_len;
    *dst_len = 0;
  }
  uVar9 = 0;
  uVar6 = 0;
  do {
    if (src_len <= uVar9) {
      if (uVar6 < sVar8) {
        dst[uVar6] = '\0';
      }
      if (dst_len != (size_t *)0x0) {
        *dst_len = uVar6 + 1;
      }
      uVar9 = (ulong)((sVar8 < uVar6 + 1) - 1);
LAB_0010e3a1:
      return (int)uVar9;
    }
    bVar1 = b64reverse(src[uVar9]);
    if (0xfd < bVar1) goto LAB_0010e3a1;
    if (uVar9 + 1 < src_len) {
      cVar2 = src[uVar9 + 1];
    }
    else {
      cVar2 = '\0';
    }
    bVar3 = b64reverse(cVar2);
    iVar10 = (int)uVar9;
    if (0xfd < bVar3) {
      uVar9 = (ulong)(iVar10 + 1);
      goto LAB_0010e3a1;
    }
    if (uVar9 + 2 < src_len) {
      cVar2 = src[uVar9 + 2];
    }
    else {
      cVar2 = '\0';
    }
    bVar4 = b64reverse(cVar2);
    if (bVar4 == 0xfe) {
      uVar9 = (ulong)(iVar10 + 2);
      goto LAB_0010e3a1;
    }
    if (uVar9 + 3 < src_len) {
      cVar2 = src[uVar9 + 3];
    }
    else {
      cVar2 = '\0';
    }
    uVar5 = b64reverse(cVar2);
    if (uVar5 == 0xfe) {
      uVar9 = (ulong)(iVar10 + 3);
      goto LAB_0010e3a1;
    }
    if (uVar6 < sVar8) {
      dst[uVar6] = (bVar3 >> 4) + bVar1 * '\x04';
    }
    uVar7 = uVar6 + 1;
    if (bVar4 != 0xff) {
      if (uVar7 < sVar8) {
        dst[uVar7] = (bVar4 >> 2) + bVar3 * '\x10';
      }
      uVar7 = uVar6 + 2;
      if (uVar5 != 0xff) {
        if (uVar7 < sVar8) {
          dst[uVar7] = uVar5 + bVar4 * '@';
        }
        uVar7 = uVar6 + 3;
      }
    }
    uVar9 = uVar9 + 4;
    uVar6 = uVar7;
  } while( true );
}

Assistant:

CIVETWEB_API int
mg_base64_decode(const char *src,
                 size_t src_len,
                 unsigned char *dst,
                 size_t *dst_len)
{
	size_t i;
	unsigned char a, b, c, d;
	size_t dst_len_limit = (size_t)-1;
	size_t dst_len_used = 0;

	if (dst_len != NULL) {
		dst_len_limit = *dst_len;
		*dst_len = 0;
	}

	for (i = 0; i < src_len; i += 4) {
		/* Read 4 characters from BASE64 string */
		a = b64reverse(src[i]);
		if (a >= 254) {
			return (int)i;
		}

		b = b64reverse(((i + 1) >= src_len) ? 0 : src[i + 1]);
		if (b >= 254) {
			return (int)i + 1;
		}

		c = b64reverse(((i + 2) >= src_len) ? 0 : src[i + 2]);
		if (c == 254) {
			return (int)i + 2;
		}

		d = b64reverse(((i + 3) >= src_len) ? 0 : src[i + 3]);
		if (d == 254) {
			return (int)i + 3;
		}

		/* Add first (of 3) decoded character */
		if (dst_len_used < dst_len_limit) {
			dst[dst_len_used] = (unsigned char)((unsigned char)(a << 2)
			                                    + (unsigned char)(b >> 4));
		}
		dst_len_used++;

		if (c != 255) {
			if (dst_len_used < dst_len_limit) {

				dst[dst_len_used] = (unsigned char)((unsigned char)(b << 4)
				                                    + (unsigned char)(c >> 2));
			}
			dst_len_used++;
			if (d != 255) {
				if (dst_len_used < dst_len_limit) {
					dst[dst_len_used] =
					    (unsigned char)((unsigned char)(c << 6) + d);
				}
				dst_len_used++;
			}
		}
	}

	/* Add terminating zero */
	if (dst_len_used < dst_len_limit) {
		dst[dst_len_used] = '\0';
	}
	dst_len_used++;
	if (dst_len != NULL) {
		*dst_len = dst_len_used;
	}

	if (dst_len_used > dst_len_limit) {
		/* Out of memory */
		return 0;
	}

	/* Return -1 for "OK" */
	return -1;
}